

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Executor_RegVm.cpp
# Opt level: O3

void __thiscall ExecutorRegVm::Stop(ExecutorRegVm *this,char *error)

{
  this->codeRunning = false;
  this->callContinue = false;
  NULLC::SafeSprintf(this->execErrorBuffer,0x10000,"%s",error);
  this->execErrorMessage = this->execErrorBuffer;
  (this->execErrorObject).typeID = 0;
  (this->execErrorObject).ptr = (char *)0x0;
  return;
}

Assistant:

void ExecutorRegVm::Stop(const char* error)
{
	codeRunning = false;

	callContinue = false;

	NULLC::SafeSprintf(execErrorBuffer, NULLC_ERROR_BUFFER_SIZE, "%s", error);

	execErrorMessage = execErrorBuffer;

	execErrorObject.typeID = 0;
	execErrorObject.ptr = NULL;
}